

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exposer.cc
# Opt level: O0

void __thiscall
prometheus::Exposer::Exposer
          (Exposer *this,string *bind_address,size_t num_threads,CivetCallbacks *callbacks)

{
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_128;
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_ef;
  undefined1 local_ee;
  allocator local_ed [20];
  allocator local_d9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  string local_b0 [32];
  string local_90 [32];
  string local_70;
  iterator local_50;
  size_type local_48;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_40;
  CivetCallbacks *local_28;
  CivetCallbacks *callbacks_local;
  size_t num_threads_local;
  string *bind_address_local;
  Exposer *this_local;
  
  local_ee = 1;
  local_d8 = &local_d0;
  local_28 = callbacks;
  callbacks_local = (CivetCallbacks *)num_threads;
  num_threads_local = (size_t)bind_address;
  bind_address_local = (string *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_d0,"listening_ports",&local_d9);
  local_d8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b0;
  std::__cxx11::string::string((string *)local_d8,(string *)num_threads_local);
  local_d8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_90;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_90,"num_threads",local_ed);
  local_d8 = &local_70;
  std::__cxx11::to_string(local_d8,(unsigned_long)callbacks_local);
  local_ee = 0;
  local_50 = &local_d0;
  local_48 = 4;
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  allocator(&local_ef);
  __l._M_len = local_48;
  __l._M_array = local_50;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_40,__l,&local_ef);
  Exposer(this,&local_40,local_28);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_40);
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~allocator(&local_ef);
  local_128 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_50;
  do {
    local_128 = local_128 + -1;
    std::__cxx11::string::~string((string *)local_128);
  } while (local_128 != &local_d0);
  std::allocator<char>::~allocator((allocator<char> *)local_ed);
  std::allocator<char>::~allocator((allocator<char> *)&local_d9);
  return;
}

Assistant:

Exposer::Exposer(const std::string& bind_address, const std::size_t num_threads,
                 const CivetCallbacks* callbacks)
    : Exposer(
          std::vector<std::string>{"listening_ports", bind_address,
                                   "num_threads", std::to_string(num_threads)},
          callbacks) {}